

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::dataJointArray
          (LibraryControllersLoader *this,ParserString *data,size_t length)

{
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  ParserString *parserString;
  size_t i;
  value_type *__x;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_51;
  string local_50 [32];
  undefined8 *local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  
  if (*(long *)(in_RDI + 0x120) != 0) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      local_30 = (undefined8 *)(local_18 + local_28 * 0x10);
      __x = (value_type *)*local_30;
      this_00 = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,(char *)__x,(ulong)this_00,&local_51);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,__x);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
  }
  return true;
}

Assistant:

bool LibraryControllersLoader::dataJointArray( const ParserString* data, size_t length )
	{
		if ( !mJointSidsOrIds )
			return true;

		for ( size_t i = 0; i < length;  ++i)
		{
			const ParserString& parserString = data[i];
			mJointSidsOrIds->push_back( String( parserString.str, parserString.length ) );
		}
		return true;
	}